

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O3

void __thiscall QGraphicsWidget::~QGraphicsWidget(QGraphicsWidget *this)

{
  QArrayData *this_00;
  long lVar1;
  QGraphicsItem **ppQVar2;
  bool bVar3;
  QGraphicsScene *pQVar4;
  QGraphicsLayoutItem *pQVar5;
  Type *this_01;
  QGraphicsWidget *pQVar6;
  QArrayData *this_02;
  QArrayData *pQVar7;
  long lVar8;
  QGraphicsItem *pQVar9;
  long lVar10;
  long lVar11;
  long in_FS_OFFSET;
  QGraphicsLayout *temp;
  QList<QGraphicsItem_*> local_58;
  QGraphicsWidget *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)this = &PTR_metaObject_00814c30;
  this_00 = (QArrayData *)(this + 0x10);
  *(undefined ***)(this + 0x10) = &PTR__QGraphicsWidget_00814d98;
  *(undefined ***)(this + 0x20) = &PTR__QGraphicsWidget_00814ed0;
  lVar1 = *(long *)(this + 0x18);
  lVar8 = *(long *)(lVar1 + 0x200);
  if (lVar8 != 0) {
    lVar11 = *(long *)(lVar1 + 0x1f8);
    lVar10 = 0;
    do {
      local_58.d.d = (Data *)&local_40;
      local_40 = this;
      QtPrivate::
      sequential_erase_if<QList<QObject*>,QtPrivate::sequential_erase<QList<QObject*>,QGraphicsWidget*>(QList<QObject*>&,QGraphicsWidget*const&)::_lambda(auto:1_const&)_1_>
                ((QList<QObject_*> *)(*(long *)(*(long *)(lVar11 + lVar10) + 8) + 0x140),
                 (anon_class_8_1_54a39814_for__M_pred *)&local_58);
      lVar10 = lVar10 + 8;
    } while (lVar8 << 3 != lVar10);
  }
  QList<QAction_*>::clear((QList<QAction_*> *)(lVar1 + 0x1f0));
  pQVar4 = QGraphicsItem::scene((QGraphicsItem *)this_00);
  if ((pQVar4 != (QGraphicsScene *)0x0) &&
     (*(QGraphicsWidget **)(*(long *)&pQVar4->field_0x8 + 0x1a0) == this)) {
    pQVar6 = (QGraphicsWidget *)0x0;
    if (*(QGraphicsWidget **)(lVar1 + 0x1c0) != this) {
      pQVar6 = *(QGraphicsWidget **)(lVar1 + 0x1c0);
    }
    *(QGraphicsWidget **)(*(long *)&pQVar4->field_0x8 + 0x1a0) = pQVar6;
  }
  lVar8 = *(long *)(lVar1 + 0x1c0);
  lVar11 = *(long *)(lVar1 + 0x1c8);
  *(long *)(*(long *)(lVar11 + 0x18) + 0x1c0) = lVar8;
  *(long *)(*(long *)(lVar8 + 0x18) + 0x1c8) = lVar11;
  *(QGraphicsWidget **)(lVar1 + 0x1c0) = this;
  *(QGraphicsWidget **)(lVar1 + 0x1c8) = this;
  this_02 = this_00;
  QGraphicsItem::clearFocus((QGraphicsItem *)this_00);
  pQVar7 = *(QArrayData **)(lVar1 + 0x180);
  if (pQVar7 != (QArrayData *)0x0) {
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
    QGraphicsItem::childItems(&local_58,(QGraphicsItem *)this_00);
    ppQVar2 = local_58.d.ptr;
    if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
      lVar11 = local_58.d.size << 3;
      lVar8 = 0;
      do {
        pQVar9 = *(QGraphicsItem **)((long)ppQVar2 + lVar8);
        bVar3 = QGraphicsItem::isWidget(pQVar9);
        if (bVar3) {
          pQVar9 = pQVar9 + 1;
          pQVar5 = QGraphicsLayoutItem::parentLayoutItem((QGraphicsLayoutItem *)pQVar9);
          if (pQVar5 == *(QGraphicsLayoutItem **)(lVar1 + 0x180)) {
            QGraphicsLayoutItem::setParentLayoutItem
                      ((QGraphicsLayoutItem *)pQVar9,(QGraphicsLayoutItem *)0x0);
          }
        }
        lVar8 = lVar8 + 8;
      } while (lVar11 != lVar8);
    }
    *(undefined8 *)(lVar1 + 0x180) = 0;
    (**(code **)(*(long *)pQVar7 + 8))();
    this_02 = pQVar7;
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        this_02 = &(local_58.d.d)->super_QArrayData;
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
      }
    }
  }
  this_01 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_widgetStyles>_>::
            operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_widgetStyles>_>
                        *)this_02);
  QGraphicsWidgetStyles::setStyleForWidget(this_01,(QWindow *)this,(QStyle *)0x0);
  QGraphicsItem::setParentItem((QGraphicsItem *)this_00,(QGraphicsItem *)0x0);
  QGraphicsLayoutItem::~QGraphicsLayoutItem((QGraphicsLayoutItem *)(this + 0x20));
  QGraphicsObject::~QGraphicsObject((QGraphicsObject *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QGraphicsWidget::~QGraphicsWidget()
{
    Q_D(QGraphicsWidget);
#ifndef QT_NO_ACTION
    // Remove all actions from this widget
    for (auto action : std::as_const(d->actions)) {
        QActionPrivate *apriv = action->d_func();
        apriv->associatedObjects.removeAll(this);
    }
    d->actions.clear();
#endif

    if (QGraphicsScene *scn = scene()) {
        QGraphicsScenePrivate *sceneD = scn->d_func();
        if (sceneD->tabFocusFirst == this)
            sceneD->tabFocusFirst = (d->focusNext == this ? nullptr : d->focusNext);
    }
    d->focusPrev->d_func()->focusNext = d->focusNext;
    d->focusNext->d_func()->focusPrev = d->focusPrev;

    // Play it really safe
    d->focusNext = this;
    d->focusPrev = this;

    clearFocus();

    //we check if we have a layout previously
    if (d->layout) {
        QGraphicsLayout *temp = d->layout;
        const auto items = childItems();
        for (QGraphicsItem *item : items) {
            // In case of a custom layout which doesn't remove and delete items, we ensure that
            // the parent layout item does not point to the deleted layout. This code is here to
            // avoid regression from 4.4 to 4.5, because according to 4.5 docs it is not really needed.
            if (item->isWidget()) {
                QGraphicsWidget *widget = static_cast<QGraphicsWidget *>(item);
                if (widget->parentLayoutItem() == d->layout)
                    widget->setParentLayoutItem(nullptr);
            }
        }
        d->layout = nullptr;
        delete temp;
    }

    // Remove this graphics widget from widgetStyles
    widgetStyles()->setStyleForWidget(this, nullptr);

    // Unset the parent here, when we're still a QGraphicsWidget.
    // It is otherwise done in ~QGraphicsItem() where we'd be
    // calling QGraphicsWidget members on an ex-QGraphicsWidget object
    setParentItem(nullptr);
}